

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rpc.c++
# Opt level: O3

void __thiscall
capnp::_::RpcSystemBase::RpcConnectionState::SingleCapPipeline::~SingleCapPipeline
          (SingleCapPipeline *this)

{
  Disposer *pDVar1;
  undefined8 *puVar2;
  
  this[-1].cap.ptr = (ClientHook *)&PTR_addRef_006cef08;
  (this->super_PipelineHook)._vptr_PipelineHook = (_func_int **)&DAT_006cef40;
  pDVar1 = (this->cap).disposer;
  if (pDVar1 != (Disposer *)0x0) {
    (this->cap).disposer = (Disposer *)0x0;
    puVar2 = *(undefined8 **)&(this->super_Refcounted).refcount;
    (**(code **)*puVar2)(puVar2,pDVar1->_vptr_Disposer[-2] + (long)&pDVar1->_vptr_Disposer);
  }
  kj::Refcounted::~Refcounted((Refcounted *)this);
  return;
}

Assistant:

SingleCapPipeline(kj::Own<ClientHook>&& cap)
        : cap(kj::mv(cap)) {}